

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  int iVar1;
  time_t tVar2;
  Curl_llist_node *max;
  size_t offs;
  size_t ntail;
  stsentry *sts;
  Curl_llist_node *n;
  Curl_llist_node *e;
  size_t hlen;
  time_t now;
  char buffer [257];
  _Bool subdomain_local;
  char *hostname_local;
  hsts *h_local;
  
  if (h == (hsts *)0x0) {
LAB_0014980d:
    h_local = (hsts *)0x0;
  }
  else {
    buffer[0xff] = subdomain;
    unique0x100001af = (time_t *)hostname;
    tVar2 = time((time_t *)0x0);
    e = (Curl_llist_node *)strlen((char *)stack0xffffffffffffffe0);
    if ((e < (Curl_llist_node *)0x101) && (e != (Curl_llist_node *)0x0)) {
      memcpy(&now,stack0xffffffffffffffe0,(size_t)e);
      if (*(char *)((long)stack0xffffffffffffffe0 + (long)((long)&e[-1]._next + 7)) == '.') {
        e = (Curl_llist_node *)((long)&e[-1]._next + 7);
      }
      *(undefined1 *)((long)&now + (long)e) = 0;
      unique0x00004880 = &now;
      n = Curl_llist_head(&h->list);
      do {
        while( true ) {
          if (n == (Curl_llist_node *)0x0) goto LAB_0014980d;
          h_local = (hsts *)Curl_node_elem(n);
          n = Curl_node_next(n);
          if (tVar2 < ((stsentry *)h_local)->expires) break;
          Curl_node_remove((Curl_llist_node *)h_local);
          hsts_free((stsentry *)h_local);
        }
      } while ((((((buffer[0xff] & 1U) == 0) ||
                 ((((stsentry *)h_local)->includeSubDomains & 1U) == 0)) ||
                (max = (Curl_llist_node *)strlen(((stsentry *)h_local)->host), e <= max)) ||
               ((*(char *)((long)stack0xffffffffffffffe0 + ((long)e - (long)max) + -1) != '.' ||
                (iVar1 = curl_strnequal((char *)((long)stack0xffffffffffffffe0 +
                                                ((long)e - (long)max)),((stsentry *)h_local)->host,
                                        (size_t)max), iVar1 == 0)))) &&
              (iVar1 = curl_strequal((char *)stack0xffffffffffffffe0,((stsentry *)h_local)->host),
              iVar1 == 0));
    }
    else {
      h_local = (hsts *)0x0;
    }
  }
  return (stsentry *)h_local;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_node_remove(&sts->node);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}